

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DropFaceNormalsProcess.cpp
# Opt level: O1

void __thiscall
Assimp::DropFaceNormalsProcess::Execute(DropFaceNormalsProcess *this,aiScene *pScene)

{
  aiMesh *paVar1;
  aiVector3D *paVar2;
  byte bVar3;
  byte bVar4;
  Logger *pLVar5;
  runtime_error *this_00;
  ulong uVar6;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pLVar5 = DefaultLogger::get();
  Logger::debug(pLVar5,"DropFaceNormalsProcess begin");
  if ((pScene->mFlags & 8) != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,
               "Post-processing order mismatch: expecting pseudo-indexed (\"verbose\") vertices here"
               ,"");
    std::runtime_error::runtime_error(this_00,(string *)local_50);
    *(undefined ***)this_00 = &PTR__runtime_error_0082bce0;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (pScene->mNumMeshes != 0) {
    uVar6 = 0;
    bVar4 = 0;
    do {
      bVar3 = bVar4;
      paVar1 = pScene->mMeshes[uVar6];
      paVar2 = paVar1->mNormals;
      if (paVar2 != (aiVector3D *)0x0) {
        operator_delete__(paVar2);
        paVar1->mNormals = (aiVector3D *)0x0;
      }
      uVar6 = uVar6 + 1;
      bVar4 = bVar3 | paVar2 != (aiVector3D *)0x0;
    } while (uVar6 < pScene->mNumMeshes);
    if ((bool)(bVar3 | paVar2 != (aiVector3D *)0x0)) {
      pLVar5 = DefaultLogger::get();
      Logger::info(pLVar5,"DropFaceNormalsProcess finished. Face normals have been removed");
      return;
    }
  }
  pLVar5 = DefaultLogger::get();
  Logger::debug(pLVar5,"DropFaceNormalsProcess finished. No normals were present");
  return;
}

Assistant:

void DropFaceNormalsProcess::Execute( aiScene* pScene) {
    ASSIMP_LOG_DEBUG("DropFaceNormalsProcess begin");

    if (pScene->mFlags & AI_SCENE_FLAGS_NON_VERBOSE_FORMAT) {
        throw DeadlyImportError("Post-processing order mismatch: expecting pseudo-indexed (\"verbose\") vertices here");
    }

    bool bHas = false;
    for( unsigned int a = 0; a < pScene->mNumMeshes; a++) {
        bHas |= this->DropMeshFaceNormals( pScene->mMeshes[a]);
    }
    if (bHas)   {
        ASSIMP_LOG_INFO("DropFaceNormalsProcess finished. "
            "Face normals have been removed");
    } else {
        ASSIMP_LOG_DEBUG("DropFaceNormalsProcess finished. "
            "No normals were present");
    }
}